

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::PlotErrorBarsEx<ImPlot::GetterError<float>>(char *label_id,GetterError<float> *getter)

{
  float fVar1;
  ImPlotRange IVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  ImPlotPlot *pIVar11;
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [12];
  double dVar17;
  ImPlotContext *pIVar18;
  bool bVar19;
  uint uVar20;
  ImU32 col;
  long lVar21;
  ImDrawList *this;
  int iVar22;
  int iVar23;
  int iVar24;
  ImPlotRange *pIVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  float fVar29;
  undefined1 auVar30 [16];
  double dVar31;
  undefined1 auVar32 [16];
  ImPlotRange in_XMM9;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_80;
  undefined1 local_78 [16];
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  undefined1 local_48 [24];
  
  bVar19 = BeginItem(label_id,-1);
  pIVar18 = GImPlot;
  if (bVar19) {
    if ((GImPlot->FitThisFrame == true) && (iVar22 = getter->Count, 0 < iVar22)) {
      pfVar7 = getter->Xs;
      pfVar8 = getter->Ys;
      iVar24 = getter->Offset;
      iVar3 = getter->Stride;
      pfVar9 = getter->Neg;
      pfVar10 = getter->Pos;
      pIVar11 = GImPlot->CurrentPlot;
      iVar4 = pIVar11->CurrentYAxis;
      uVar5 = (pIVar11->XAxis).Flags;
      pIVar25 = GImPlot->ExtentsY + iVar4;
      uVar6 = pIVar11->YAxis[iVar4].Flags;
      iVar23 = 0;
      uVar20 = uVar5 & 0x20;
      local_78._0_4_ = uVar20;
      do {
        lVar21 = (long)(((iVar24 + iVar23) % iVar22 + iVar22) % iVar22) * (long)iVar3;
        fVar1 = *(float *)((long)pfVar7 + lVar21);
        dVar13 = (double)*(float *)((long)pfVar8 + lVar21);
        fVar29 = *(float *)((long)pfVar10 + lVar21);
        dVar14 = (double)fVar1;
        dVar31 = dVar13 - (double)*(float *)((long)pfVar9 + lVar21);
        if ((uVar5 >> 10 & 1) == 0) {
          if ((long)ABS(dVar14) < 0x7ff0000000000000) {
LAB_001fdf38:
            if ((0.0 < fVar1) || (uVar20 == 0)) {
              IVar2 = pIVar18->ExtentsX;
              auVar16._4_8_ = in_XMM9.Max;
              auVar16._0_4_ = IVar2.Min._4_4_;
              auVar33._0_8_ = auVar16._0_8_ << 0x20;
              auVar33._8_4_ = IVar2.Max._0_4_;
              auVar33._12_4_ = IVar2.Max._4_4_;
              uVar27 = -(ulong)(dVar14 < IVar2.Min);
              uVar28 = -(ulong)(auVar33._8_8_ < dVar14);
              uVar26 = (ulong)dVar14 & uVar28;
              auVar34._0_8_ = ~uVar27 & (ulong)IVar2.Min;
              auVar34._8_8_ = ~uVar28 & (ulong)IVar2.Max;
              auVar15._8_4_ = (int)uVar26;
              auVar15._0_8_ = (ulong)dVar14 & uVar27;
              auVar15._12_4_ = (int)(uVar26 >> 0x20);
              in_XMM9 = (ImPlotRange)(auVar34 | auVar15);
              pIVar18->ExtentsX = in_XMM9;
            }
          }
        }
        else if ((((long)ABS(dVar14) < 0x7ff0000000000000) &&
                 (pIVar11->YAxis[iVar4].Range.Min <= dVar31)) &&
                (dVar31 <= pIVar11->YAxis[iVar4].Range.Max)) goto LAB_001fdf38;
        if ((uVar6 >> 10 & 1) == 0) {
          if ((long)ABS(dVar31) < 0x7ff0000000000000) {
LAB_001fdfbc:
            if ((0.0 < dVar31) || ((uVar6 & 0x20) == 0)) {
              dVar17 = pIVar18->ExtentsY[iVar4].Max;
              uVar26 = -(ulong)(dVar31 < pIVar25->Min);
              uVar27 = -(ulong)(dVar17 < dVar31);
              auVar32._0_8_ = (ulong)dVar31 & uVar26;
              auVar32._8_8_ = (ulong)dVar31 & uVar27;
              auVar35._0_8_ = ~uVar26 & (ulong)pIVar25->Min;
              auVar35._8_8_ = ~uVar27 & (ulong)dVar17;
              in_XMM9 = (ImPlotRange)(auVar35 | auVar32);
              *pIVar25 = in_XMM9;
            }
          }
        }
        else if ((((long)ABS(dVar31) < 0x7ff0000000000000) && ((pIVar11->XAxis).Range.Min <= dVar14)
                 ) && (dVar14 <= (pIVar11->XAxis).Range.Max)) goto LAB_001fdfbc;
        dVar13 = dVar13 + (double)fVar29;
        if ((uVar5 >> 10 & 1) == 0) {
          if ((long)ABS(dVar14) < 0x7ff0000000000000) {
LAB_001fe036:
            if ((0.0 < fVar1) || (uVar20 == 0)) {
              dVar31 = (pIVar18->ExtentsX).Min;
              dVar17 = (pIVar18->ExtentsX).Max;
              uVar26 = -(ulong)(dVar14 < dVar31);
              uVar27 = -(ulong)(dVar17 < dVar14);
              (pIVar18->ExtentsX).Min = (double)(~uVar26 & (ulong)dVar31 | (ulong)dVar14 & uVar26);
              (pIVar18->ExtentsX).Max = (double)(~uVar27 & (ulong)dVar17 | (ulong)dVar14 & uVar27);
            }
          }
        }
        else if ((((long)ABS(dVar14) < 0x7ff0000000000000) &&
                 (pIVar11->YAxis[iVar4].Range.Min <= dVar13)) &&
                (dVar13 <= pIVar11->YAxis[iVar4].Range.Max)) goto LAB_001fe036;
        if ((uVar6 >> 10 & 1) == 0) {
          if ((long)ABS(dVar13) < 0x7ff0000000000000) {
LAB_001fe0b4:
            if ((0.0 < dVar13) || ((uVar6 & 0x20) == 0)) {
              dVar14 = pIVar18->ExtentsY[iVar4].Max;
              uVar27 = -(ulong)(dVar13 < pIVar25->Min);
              uVar28 = -(ulong)(dVar14 < dVar13);
              uVar26 = (ulong)dVar13 & uVar28;
              auVar30._0_8_ = ~uVar27 & (ulong)pIVar25->Min;
              auVar30._8_8_ = ~uVar28 & (ulong)dVar14;
              auVar12._8_4_ = (int)uVar26;
              auVar12._0_8_ = (ulong)dVar13 & uVar27;
              auVar12._12_4_ = (int)(uVar26 >> 0x20);
              *pIVar25 = (ImPlotRange)(auVar30 | auVar12);
            }
          }
        }
        else if ((((long)ABS(dVar13) < 0x7ff0000000000000) && ((pIVar11->XAxis).Range.Min <= dVar14)
                 ) && (dVar14 <= (pIVar11->XAxis).Range.Max)) goto LAB_001fe0b4;
        iVar23 = iVar23 + 1;
      } while (iVar22 != iVar23);
    }
    this = GetPlotDrawList();
    col = ImGui::GetColorU32((pIVar18->NextItemData).Colors + 4);
    iVar22 = getter->Count;
    if (0 < iVar22) {
      fVar1 = (pIVar18->NextItemData).ErrorBarSize;
      fVar29 = fVar1 * 0.5;
      local_78 = ZEXT416((uint)fVar29);
      local_48._0_16_ = ZEXT416((uint)fVar29);
      iVar24 = 0;
      do {
        lVar21 = (long)(((getter->Offset + iVar24) % iVar22 + iVar22) % iVar22) *
                 (long)getter->Stride;
        dVar13 = (double)*(float *)((long)getter->Xs + lVar21);
        dVar14 = (double)*(float *)((long)getter->Ys + lVar21);
        fVar29 = *(float *)((long)getter->Pos + lVar21);
        local_50 = PlotToPixels(dVar13,dVar14 - (double)*(float *)((long)getter->Neg + lVar21),-1);
        local_58 = PlotToPixels(dVar13,(double)fVar29 + dVar14,-1);
        ImDrawList::AddLine(this,&local_50,&local_58,col,(pIVar18->NextItemData).ErrorBarWeight);
        if (0.0 < fVar1) {
          local_80.y = local_50.y;
          local_80.x = local_50.x - (float)local_78._0_4_;
          local_60.y = local_50.y + (float)local_48._4_4_;
          local_60.x = local_50.x + (float)local_48._0_4_;
          ImDrawList::AddLine(this,&local_80,&local_60,col,(pIVar18->NextItemData).ErrorBarWeight);
          local_80.y = local_58.y;
          local_80.x = local_58.x - (float)local_78._0_4_;
          local_60.y = local_58.y + (float)local_48._4_4_;
          local_60.x = local_58.x + (float)local_48._0_4_;
          ImDrawList::AddLine(this,&local_80,&local_60,col,(pIVar18->NextItemData).ErrorBarWeight);
        }
        iVar24 = iVar24 + 1;
        iVar22 = getter->Count;
      } while (iVar24 < iVar22);
    }
    pIVar18 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar18->NextItemData);
    pIVar18->PreviousItem = pIVar18->CurrentItem;
    pIVar18->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

void PlotErrorBarsEx(const char* label_id, const Getter& getter) {
    if (BeginItem(label_id)) {
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPointError e = getter(i);
                FitPoint(ImPlotPoint(e.X , e.Y - e.Neg));
                FitPoint(ImPlotPoint(e.X , e.Y + e.Pos ));
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        const ImU32 col = ImGui::GetColorU32(s.Colors[ImPlotCol_ErrorBar]);
        const bool rend_whisker  = s.ErrorBarSize > 0;
        const float half_whisker = s.ErrorBarSize * 0.5f;
        for (int i = 0; i < getter.Count; ++i) {
            ImPlotPointError e = getter(i);
            ImVec2 p1 = PlotToPixels(e.X, e.Y - e.Neg);
            ImVec2 p2 = PlotToPixels(e.X, e.Y + e.Pos);
            DrawList.AddLine(p1,p2,col, s.ErrorBarWeight);
            if (rend_whisker) {
                DrawList.AddLine(p1 - ImVec2(half_whisker, 0), p1 + ImVec2(half_whisker, 0), col, s.ErrorBarWeight);
                DrawList.AddLine(p2 - ImVec2(half_whisker, 0), p2 + ImVec2(half_whisker, 0), col, s.ErrorBarWeight);
            }
        }
        EndItem();
    }
}